

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  BBox1f BVar3;
  ushort uVar4;
  ushort uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  Geometry *pGVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  float fVar80;
  float fVar81;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  float fVar82;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar86;
  vint4 ai;
  undefined1 auVar87 [16];
  vint4 ai_2;
  vint4 bi;
  undefined1 auVar88 [16];
  vint4 ai_6;
  undefined1 auVar89 [16];
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  vint4 bi_8;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  float fVar115;
  undefined1 auVar114 [32];
  float fVar116;
  float fVar117;
  float fVar118;
  vint4 bi_3;
  undefined1 auVar119 [64];
  vint4 bi_6;
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  float old_t;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_ce9;
  Geometry *local_ce8;
  ulong local_ce0;
  ulong local_cd8;
  size_t local_cd0;
  RayK<8> *local_cc8;
  uint local_cc0;
  uint local_cbc;
  ulong local_cb8;
  ulong local_cb0;
  ulong local_ca8;
  long local_ca0;
  long local_c98;
  long local_c90;
  ulong *local_c88;
  ulong local_c80;
  long local_c78;
  long local_c70;
  Scene *local_c68;
  ulong local_c60;
  long local_c58;
  long local_c50;
  ulong local_c48;
  undefined1 local_c40 [32];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  float local_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 *local_a00;
  char local_9f8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_c88 = local_7f8;
  local_800 = root.ptr;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar121 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar122 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar123 = ZEXT1664(auVar39);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar38 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar80 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar86 * 0.99999964)));
  auVar124 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar38 * 0.99999964)));
  auVar125 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar80 * 0.99999964)));
  auVar126 = ZEXT1664(auVar39);
  fVar86 = fVar86 * 1.0000004;
  fVar38 = fVar38 * 1.0000004;
  fVar80 = fVar80 * 1.0000004;
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_c48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar33 = uVar32 ^ 0x10;
  uVar35 = local_c48 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_b00._4_4_ = iVar1;
  local_b00._0_4_ = iVar1;
  local_b00._8_4_ = iVar1;
  local_b00._12_4_ = iVar1;
  auVar119 = ZEXT1664(local_b00);
  iVar1 = (tray->tfar).field_0.i[k];
  local_b10._4_4_ = iVar1;
  local_b10._0_4_ = iVar1;
  local_b10._8_4_ = iVar1;
  local_b10._12_4_ = iVar1;
  auVar120 = ZEXT1664(local_b10);
  local_ac0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar37 = true;
  fVar81 = fVar86;
  fVar82 = fVar86;
  fVar83 = fVar86;
  fVar84 = fVar38;
  fVar85 = fVar38;
  fVar115 = fVar38;
  fVar116 = fVar80;
  fVar117 = fVar80;
  fVar118 = fVar80;
  local_cd0 = k;
  local_cc8 = ray;
  local_ca8 = uVar32;
  local_af0 = fVar80;
  fStack_aec = fVar80;
  fStack_ae8 = fVar80;
  fStack_ae4 = fVar80;
  local_ae0 = fVar38;
  fStack_adc = fVar38;
  fStack_ad8 = fVar38;
  fStack_ad4 = fVar38;
  local_ad0 = fVar86;
  fStack_acc = fVar86;
  fStack_ac8 = fVar86;
  fStack_ac4 = fVar86;
  do {
    uVar34 = local_c88[-1];
    local_c88 = local_c88 + -1;
    while ((uVar34 & 8) == 0) {
      uVar21 = uVar34 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar43._4_4_ = uVar2;
      auVar43._0_4_ = uVar2;
      auVar43._8_4_ = uVar2;
      auVar43._12_4_ = uVar2;
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar32),auVar43,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar32));
      auVar40 = vsubps_avx512vl(auVar39,auVar121._0_16_);
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + local_c48),auVar43,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + local_c48));
      auVar40 = vmulps_avx512vl(auVar124._0_16_,auVar40);
      auVar41 = vsubps_avx512vl(auVar39,auVar122._0_16_);
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar27),auVar43,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar27));
      auVar41 = vmulps_avx512vl(auVar125._0_16_,auVar41);
      auVar39 = vsubps_avx512vl(auVar39,auVar123._0_16_);
      auVar39 = vmulps_avx512vl(auVar126._0_16_,auVar39);
      auVar39 = vmaxps_avx(auVar41,auVar39);
      auVar40 = vmaxps_avx(auVar119._0_16_,auVar40);
      auVar39 = vmaxps_avx(auVar40,auVar39);
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar33),auVar43,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar33));
      auVar40 = vsubps_avx512vl(auVar40,auVar121._0_16_);
      auVar41._0_4_ = fVar86 * auVar40._0_4_;
      auVar41._4_4_ = fVar81 * auVar40._4_4_;
      auVar41._8_4_ = fVar82 * auVar40._8_4_;
      auVar41._12_4_ = fVar83 * auVar40._12_4_;
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + uVar35),auVar43,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + uVar35));
      auVar40 = vsubps_avx512vl(auVar40,auVar122._0_16_);
      auVar89._0_4_ = fVar38 * auVar40._0_4_;
      auVar89._4_4_ = fVar84 * auVar40._4_4_;
      auVar89._8_4_ = fVar85 * auVar40._8_4_;
      auVar89._12_4_ = fVar115 * auVar40._12_4_;
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x80 + (uVar27 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar21 + 0x20 + (uVar27 ^ 0x10)));
      auVar40 = vsubps_avx512vl(auVar40,auVar123._0_16_);
      auVar44._0_4_ = fVar80 * auVar40._0_4_;
      auVar44._4_4_ = fVar116 * auVar40._4_4_;
      auVar44._8_4_ = fVar117 * auVar40._8_4_;
      auVar44._12_4_ = fVar118 * auVar40._12_4_;
      auVar40 = vminps_avx(auVar89,auVar44);
      auVar41 = vminps_avx(auVar120._0_16_,auVar41);
      auVar40 = vminps_avx(auVar41,auVar40);
      uVar12 = vcmpps_avx512vl(auVar39,auVar40,2);
      uVar30 = (uint)uVar12;
      if (((uint)uVar34 & 7) == 6) {
        uVar13 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [16])(uVar21 + 0xf0),1);
        uVar14 = vcmpps_avx512vl(auVar43,*(undefined1 (*) [16])(uVar21 + 0xe0),0xd);
        uVar30 = (uint)(byte)((byte)uVar13 & (byte)uVar14 & (byte)uVar12);
      }
      if ((byte)uVar30 == 0) goto LAB_0075fc7f;
      lVar25 = 0;
      for (uVar34 = (ulong)(byte)uVar30; (uVar34 & 1) == 0;
          uVar34 = uVar34 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar34 = *(ulong *)(uVar21 + lVar25 * 8);
      uVar30 = (uVar30 & 0xff) - 1 & uVar30 & 0xff;
      uVar28 = (ulong)uVar30;
      if (uVar30 != 0) {
        *local_c88 = uVar34;
        lVar25 = 0;
        for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar30 = uVar30 - 1 & uVar30;
        uVar28 = (ulong)uVar30;
        bVar36 = uVar30 == 0;
        while( true ) {
          local_c88 = local_c88 + 1;
          uVar34 = *(ulong *)(uVar21 + lVar25 * 8);
          if (bVar36) break;
          *local_c88 = uVar34;
          lVar25 = 0;
          for (uVar34 = uVar28; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar28 = uVar28 - 1 & uVar28;
          bVar36 = uVar28 == 0;
        }
      }
    }
    local_c90 = (ulong)((uint)uVar34 & 0xf) - 8;
    if (local_c90 != 0) {
      uVar34 = uVar34 & 0xfffffffffffffff0;
      local_c98 = 0;
      do {
        local_ca0 = local_c98 * 0x90;
        fVar11 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar34 + 0x80 + local_ca0)) *
                 *(float *)(uVar34 + 0x84 + local_ca0);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(uVar34 + 0x20 + local_ca0);
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(uVar34 + 0x24 + local_ca0);
        uVar12 = vpcmpub_avx512vl(auVar39,auVar53,2);
        auVar39 = vpmovzxbd_avx(auVar39);
        uVar2 = *(undefined4 *)(uVar34 + 0x44 + local_ca0);
        auVar47._4_4_ = uVar2;
        auVar47._0_4_ = uVar2;
        auVar47._8_4_ = uVar2;
        auVar47._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar34 + 0x38 + local_ca0);
        auVar52._4_4_ = uVar2;
        auVar52._0_4_ = uVar2;
        auVar52._8_4_ = uVar2;
        auVar52._12_4_ = uVar2;
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar40 = vfmadd213ps_fma(auVar39,auVar47,auVar52);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(uVar34 + 0x50 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar42);
        auVar39 = vcvtdq2ps_avx(auVar39);
        uVar2 = *(undefined4 *)(uVar34 + 0x74 + local_ca0);
        auVar99._4_4_ = uVar2;
        auVar99._0_4_ = uVar2;
        auVar99._8_4_ = uVar2;
        auVar99._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar34 + 0x68 + local_ca0);
        auVar102._4_4_ = uVar2;
        auVar102._0_4_ = uVar2;
        auVar102._8_4_ = uVar2;
        auVar102._12_4_ = uVar2;
        auVar39 = vfmadd213ps_fma(auVar39,auVar99,auVar102);
        auVar87._4_4_ = fVar11;
        auVar87._0_4_ = fVar11;
        auVar87._8_4_ = fVar11;
        auVar87._12_4_ = fVar11;
        auVar39 = vsubps_avx(auVar39,auVar40);
        auVar40 = vfmadd213ps_fma(auVar39,auVar87,auVar40);
        auVar39 = vpmovzxbd_avx(auVar53);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar41 = vfmadd213ps_fma(auVar39,auVar47,auVar52);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)(uVar34 + 0x54 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar46);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar39 = vfmadd213ps_fma(auVar39,auVar99,auVar102);
        auVar39 = vsubps_avx(auVar39,auVar41);
        auVar41 = vfmadd213ps_fma(auVar39,auVar87,auVar41);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(uVar34 + 0x28 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar48);
        auVar39 = vcvtdq2ps_avx(auVar39);
        uVar2 = *(undefined4 *)(uVar34 + 0x48 + local_ca0);
        auVar90._4_4_ = uVar2;
        auVar90._0_4_ = uVar2;
        auVar90._8_4_ = uVar2;
        auVar90._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar34 + 0x3c + local_ca0);
        auVar95._4_4_ = uVar2;
        auVar95._0_4_ = uVar2;
        auVar95._8_4_ = uVar2;
        auVar95._12_4_ = uVar2;
        auVar43 = vfmadd213ps_fma(auVar39,auVar90,auVar95);
        auVar100._8_8_ = 0;
        auVar100._0_8_ = *(ulong *)(uVar34 + 0x58 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar100);
        auVar39 = vcvtdq2ps_avx(auVar39);
        uVar2 = *(undefined4 *)(uVar34 + 0x78 + local_ca0);
        auVar103._4_4_ = uVar2;
        auVar103._0_4_ = uVar2;
        auVar103._8_4_ = uVar2;
        auVar103._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar34 + 0x6c + local_ca0);
        auVar106._4_4_ = uVar2;
        auVar106._0_4_ = uVar2;
        auVar106._8_4_ = uVar2;
        auVar106._12_4_ = uVar2;
        auVar39 = vfmadd213ps_fma(auVar39,auVar103,auVar106);
        auVar39 = vsubps_avx(auVar39,auVar43);
        auVar43 = vfmadd213ps_fma(auVar39,auVar87,auVar43);
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)(uVar34 + 0x2c + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar49);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar89 = vfmadd213ps_fma(auVar39,auVar90,auVar95);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = *(ulong *)(uVar34 + 0x5c + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar91);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar39 = vfmadd213ps_fma(auVar39,auVar103,auVar106);
        auVar39 = vsubps_avx(auVar39,auVar89);
        auVar89 = vfmadd213ps_fma(auVar39,auVar87,auVar89);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = *(ulong *)(uVar34 + 0x30 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar50);
        auVar39 = vcvtdq2ps_avx(auVar39);
        uVar2 = *(undefined4 *)(uVar34 + 0x4c + local_ca0);
        auVar96._4_4_ = uVar2;
        auVar96._0_4_ = uVar2;
        auVar96._8_4_ = uVar2;
        auVar96._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar34 + 0x40 + local_ca0);
        auVar104._4_4_ = uVar2;
        auVar104._0_4_ = uVar2;
        auVar104._8_4_ = uVar2;
        auVar104._12_4_ = uVar2;
        auVar44 = vfmadd213ps_fma(auVar39,auVar96,auVar104);
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)(uVar34 + 0x60 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar107);
        uVar2 = *(undefined4 *)(uVar34 + 0x7c + local_ca0);
        auVar109._4_4_ = uVar2;
        auVar109._0_4_ = uVar2;
        auVar109._8_4_ = uVar2;
        auVar109._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(uVar34 + 0x70 + local_ca0);
        auVar112._4_4_ = uVar2;
        auVar112._0_4_ = uVar2;
        auVar112._8_4_ = uVar2;
        auVar112._12_4_ = uVar2;
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar39 = vfmadd213ps_fma(auVar39,auVar109,auVar112);
        auVar39 = vsubps_avx(auVar39,auVar44);
        auVar44 = vfmadd213ps_fma(auVar39,auVar87,auVar44);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(uVar34 + 0x34 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar51);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar42 = vfmadd213ps_fma(auVar39,auVar96,auVar104);
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(uVar34 + 100 + local_ca0);
        auVar39 = vpmovzxbd_avx(auVar97);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar39 = vfmadd213ps_fma(auVar39,auVar109,auVar112);
        auVar39 = vsubps_avx(auVar39,auVar42);
        auVar39 = vfmadd213ps_fma(auVar39,auVar87,auVar42);
        auVar40 = vsubps_avx512vl(auVar40,auVar121._0_16_);
        auVar42 = vmulps_avx512vl(auVar124._0_16_,auVar40);
        auVar40 = vsubps_avx512vl(auVar43,auVar122._0_16_);
        auVar43 = vmulps_avx512vl(auVar125._0_16_,auVar40);
        auVar40 = vsubps_avx512vl(auVar44,auVar123._0_16_);
        auVar44 = vmulps_avx512vl(auVar126._0_16_,auVar40);
        auVar40 = vsubps_avx512vl(auVar41,auVar121._0_16_);
        auVar45._0_4_ = fVar86 * auVar40._0_4_;
        auVar45._4_4_ = fVar81 * auVar40._4_4_;
        auVar45._8_4_ = fVar82 * auVar40._8_4_;
        auVar45._12_4_ = fVar83 * auVar40._12_4_;
        auVar40 = vsubps_avx512vl(auVar89,auVar122._0_16_);
        auVar92._0_4_ = fVar38 * auVar40._0_4_;
        auVar92._4_4_ = fVar84 * auVar40._4_4_;
        auVar92._8_4_ = fVar85 * auVar40._8_4_;
        auVar92._12_4_ = fVar115 * auVar40._12_4_;
        auVar39 = vsubps_avx512vl(auVar39,auVar123._0_16_);
        auVar98._0_4_ = fVar80 * auVar39._0_4_;
        auVar98._4_4_ = fVar116 * auVar39._4_4_;
        auVar98._8_4_ = fVar117 * auVar39._8_4_;
        auVar98._12_4_ = fVar118 * auVar39._12_4_;
        auVar40 = vpminsd_avx(auVar42,auVar45);
        auVar39 = vpmaxsd_avx(auVar42,auVar45);
        auVar41 = vpminsd_avx(auVar43,auVar92);
        auVar40 = vpmaxsd_avx(auVar40,auVar41);
        auVar41 = vpmaxsd_avx(auVar43,auVar92);
        auVar43 = vpminsd_avx(auVar39,auVar41);
        auVar41 = vpminsd_avx(auVar44,auVar98);
        auVar39 = vpmaxsd_avx(auVar44,auVar98);
        auVar41 = vpmaxsd_avx(auVar41,auVar119._0_16_);
        auVar40 = vpmaxsd_avx(auVar40,auVar41);
        auVar39 = vpminsd_avx(auVar39,auVar120._0_16_);
        auVar39 = vpminsd_avx(auVar43,auVar39);
        local_c80 = vpcmpd_avx512vl(auVar40,auVar39,2);
        local_c80 = ((byte)uVar12 & 0xf) & local_c80;
        if ((char)local_c80 != '\0') {
          local_ca0 = local_ca0 + uVar34;
          do {
            lVar25 = 0;
            for (uVar32 = local_c80; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar4 = *(ushort *)(local_ca0 + lVar25 * 8);
            uVar5 = *(ushort *)(local_ca0 + 2 + lVar25 * 8);
            local_cb8 = (ulong)*(uint *)(local_ca0 + 0x88);
            local_cb0 = (ulong)*(uint *)(local_ca0 + 4 + lVar25 * 8);
            local_c68 = context->scene;
            pGVar31 = (local_c68->geometries).items[local_cb8].ptr;
            local_c70 = *(long *)&pGVar31->field_0x58;
            BVar3 = pGVar31->time_range;
            auVar40._8_8_ = 0;
            auVar40._0_4_ = BVar3.lower;
            auVar40._4_4_ = BVar3.upper;
            fVar86 = BVar3.lower;
            auVar77._4_4_ = fVar86;
            auVar77._0_4_ = fVar86;
            auVar77._8_4_ = fVar86;
            auVar77._12_4_ = fVar86;
            auVar77._16_4_ = fVar86;
            auVar77._20_4_ = fVar86;
            auVar77._24_4_ = fVar86;
            auVar77._28_4_ = fVar86;
            fVar86 = pGVar31->fnumTimeSegments;
            auVar88._4_4_ = fVar86;
            auVar88._0_4_ = fVar86;
            auVar88._8_4_ = fVar86;
            auVar88._12_4_ = fVar86;
            auVar77 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar77);
            auVar39 = vmovshdup_avx(auVar40);
            auVar39 = vsubps_avx(auVar39,auVar40);
            auVar73._0_4_ = auVar39._0_4_;
            auVar73._4_4_ = auVar73._0_4_;
            auVar73._8_4_ = auVar73._0_4_;
            auVar73._12_4_ = auVar73._0_4_;
            auVar73._16_4_ = auVar73._0_4_;
            auVar73._20_4_ = auVar73._0_4_;
            auVar73._24_4_ = auVar73._0_4_;
            auVar73._28_4_ = auVar73._0_4_;
            auVar77 = vdivps_avx(auVar77,auVar73);
            auVar78._4_4_ = fVar86 * auVar77._4_4_;
            auVar78._0_4_ = fVar86 * auVar77._0_4_;
            auVar78._8_4_ = fVar86 * auVar77._8_4_;
            auVar78._12_4_ = fVar86 * auVar77._12_4_;
            auVar78._16_4_ = fVar86 * auVar77._16_4_;
            auVar78._20_4_ = fVar86 * auVar77._20_4_;
            auVar78._24_4_ = fVar86 * auVar77._24_4_;
            auVar78._28_4_ = auVar77._28_4_;
            auVar77 = vroundps_avx(auVar78,1);
            auVar39 = vaddss_avx512f(auVar88,SUB6416(ZEXT464(0xbf800000),0));
            auVar74._0_4_ = auVar39._0_4_;
            auVar74._4_4_ = auVar74._0_4_;
            auVar74._8_4_ = auVar74._0_4_;
            auVar74._12_4_ = auVar74._0_4_;
            auVar74._16_4_ = auVar74._0_4_;
            auVar74._20_4_ = auVar74._0_4_;
            auVar74._24_4_ = auVar74._0_4_;
            auVar74._28_4_ = auVar74._0_4_;
            auVar77 = vminps_avx(auVar77,auVar74);
            auVar77 = vmaxps_avx(auVar77,_DAT_01faff00);
            local_a80 = vsubps_avx(auVar78,auVar77);
            local_aa0 = vcvtps2dq_avx(auVar77);
            local_c78 = pGVar31[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                        * local_cb0;
            local_cbc = uVar4 & 0x7fff;
            local_cc0 = uVar5 & 0x7fff;
            uVar30 = *(uint *)(local_c70 + 4 + local_c78);
            local_c60 = (ulong)uVar30;
            uVar21 = (ulong)(uVar30 * local_cc0 + *(int *)(local_c70 + local_c78) + local_cbc);
            lVar25 = *(long *)&pGVar31[2].numPrimitives;
            lVar23 = (long)*(int *)(local_aa0 + k * 4) * 0x38;
            lVar6 = *(long *)(lVar25 + 0x10 + lVar23);
            lVar7 = *(long *)(lVar25 + lVar23);
            auVar39 = *(undefined1 (*) [16])(lVar7 + lVar6 * uVar21);
            lVar8 = *(long *)(lVar25 + 0x48 + lVar23);
            auVar40 = *(undefined1 (*) [16])(lVar7 + (uVar21 + 1) * lVar6);
            lVar29 = local_c60 + uVar21;
            auVar41 = *(undefined1 (*) [16])(lVar7 + lVar29 * lVar6);
            lVar26 = uVar21 + local_c60 + 1;
            auVar43 = *(undefined1 (*) [16])(lVar7 + lVar26 * lVar6);
            local_c50 = lVar8 * lVar29;
            local_c58 = lVar8 * lVar26;
            uVar32 = (ulong)(-1 < (short)uVar4);
            lVar22 = uVar21 + uVar32 + 1;
            auVar89 = *(undefined1 (*) [16])(lVar7 + lVar22 * lVar6);
            lVar24 = uVar32 + lVar26;
            auVar44 = *(undefined1 (*) [16])(lVar7 + lVar24 * lVar6);
            uVar32 = 0;
            if (-1 < (short)uVar5) {
              uVar32 = local_c60;
            }
            auVar42 = *(undefined1 (*) [16])(lVar7 + (lVar29 + uVar32) * lVar6);
            auVar87 = *(undefined1 (*) [16])(lVar7 + (lVar26 + uVar32) * lVar6);
            auVar53 = *(undefined1 (*) [16])(lVar7 + lVar6 * (uVar32 + lVar24));
            lVar25 = *(long *)(lVar25 + 0x38 + lVar23);
            auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_a80 + local_cd0 * 4)));
            auVar46 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * uVar21),auVar39);
            auVar46 = vfmadd213ps_avx512vl(auVar46,auVar45,auVar39);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * (uVar21 + 1)),auVar40);
            auVar47 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar40);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + local_c50),auVar41);
            auVar48 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar41);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + local_c58),auVar43);
            auVar49 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar43);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * lVar22),auVar89);
            auVar40 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar89);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * lVar24),auVar44);
            auVar50 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar44);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + lVar8 * (lVar29 + uVar32)),auVar42)
            ;
            auVar51 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar42);
            auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar25 + lVar8 * (lVar26 + uVar32)),
                                      auVar87);
            auVar52 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar87);
            auVar39 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar25 + (uVar32 + lVar24) * lVar8),
                                      auVar53);
            auVar53 = vfmadd213ps_avx512vl(auVar39,auVar45,auVar53);
            auVar41 = vunpcklps_avx(auVar47,auVar50);
            auVar39 = vunpckhps_avx(auVar47,auVar50);
            auVar43 = vunpcklps_avx(auVar40,auVar49);
            auVar40 = vunpckhps_avx(auVar40,auVar49);
            auVar89 = vunpcklps_avx(auVar39,auVar40);
            auVar44 = vunpcklps_avx(auVar41,auVar43);
            auVar39 = vunpckhps_avx(auVar41,auVar43);
            auVar43 = vunpcklps_avx(auVar48,auVar52);
            auVar40 = vunpckhps_avx(auVar48,auVar52);
            auVar42 = vunpcklps_avx(auVar49,auVar51);
            auVar41 = vunpckhps_avx(auVar49,auVar51);
            auVar41 = vunpcklps_avx(auVar40,auVar41);
            auVar87 = vunpcklps_avx(auVar43,auVar42);
            auVar40 = vunpckhps_avx(auVar43,auVar42);
            auVar59._16_16_ = auVar52;
            auVar59._0_16_ = auVar48;
            auVar56._16_16_ = auVar50;
            auVar56._0_16_ = auVar47;
            auVar77 = vunpcklps_avx(auVar56,auVar59);
            auVar64._16_16_ = auVar49;
            auVar64._0_16_ = auVar46;
            auVar61._16_16_ = auVar53;
            auVar61._0_16_ = auVar49;
            auVar78 = vunpcklps_avx(auVar64,auVar61);
            auVar74 = vunpcklps_avx(auVar78,auVar77);
            auVar78 = vunpckhps_avx(auVar78,auVar77);
            auVar77 = vunpckhps_avx(auVar56,auVar59);
            auVar73 = vunpckhps_avx(auVar64,auVar61);
            auVar73 = vunpcklps_avx(auVar73,auVar77);
            auVar60._16_16_ = auVar44;
            auVar60._0_16_ = auVar44;
            auVar62._16_16_ = auVar39;
            auVar62._0_16_ = auVar39;
            auVar63._16_16_ = auVar89;
            auVar63._0_16_ = auVar89;
            auVar65._16_16_ = auVar87;
            auVar65._0_16_ = auVar87;
            auVar66._16_16_ = auVar40;
            auVar66._0_16_ = auVar40;
            uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4);
            auVar67._4_4_ = uVar2;
            auVar67._0_4_ = uVar2;
            auVar67._8_4_ = uVar2;
            auVar67._12_4_ = uVar2;
            auVar67._16_4_ = uVar2;
            auVar67._20_4_ = uVar2;
            auVar67._24_4_ = uVar2;
            auVar67._28_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x20);
            auVar68._4_4_ = uVar2;
            auVar68._0_4_ = uVar2;
            auVar68._8_4_ = uVar2;
            auVar68._12_4_ = uVar2;
            auVar68._16_4_ = uVar2;
            auVar68._20_4_ = uVar2;
            auVar68._24_4_ = uVar2;
            auVar68._28_4_ = uVar2;
            auVar54 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_cc8 + local_cd0 * 4 + 0x40)));
            uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x80);
            auVar101._4_4_ = uVar2;
            auVar101._0_4_ = uVar2;
            auVar101._8_4_ = uVar2;
            auVar101._12_4_ = uVar2;
            auVar101._16_4_ = uVar2;
            auVar101._20_4_ = uVar2;
            auVar101._24_4_ = uVar2;
            auVar101._28_4_ = uVar2;
            auVar55 = vinsertf32x4_avx512vl(ZEXT1632(auVar41),auVar41,1);
            uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0xa0);
            auVar110._4_4_ = uVar2;
            auVar110._0_4_ = uVar2;
            auVar110._8_4_ = uVar2;
            auVar110._12_4_ = uVar2;
            auVar110._16_4_ = uVar2;
            auVar110._20_4_ = uVar2;
            auVar110._24_4_ = uVar2;
            auVar110._28_4_ = uVar2;
            fVar86 = *(float *)(local_cc8 + local_cd0 * 4 + 0xc0);
            auVar113._4_4_ = fVar86;
            auVar113._0_4_ = fVar86;
            auVar113._8_4_ = fVar86;
            auVar113._12_4_ = fVar86;
            auVar113._16_4_ = fVar86;
            auVar113._20_4_ = fVar86;
            auVar113._24_4_ = fVar86;
            auVar113._28_4_ = fVar86;
            auVar77 = vsubps_avx(auVar74,auVar67);
            auVar78 = vsubps_avx(auVar78,auVar68);
            auVar56 = vsubps_avx512vl(auVar73,auVar54);
            auVar73 = vsubps_avx(auVar60,auVar67);
            auVar74 = vsubps_avx(auVar62,auVar68);
            auVar57 = vsubps_avx512vl(auVar63,auVar54);
            auVar58 = vsubps_avx512vl(auVar65,auVar67);
            auVar59 = vsubps_avx512vl(auVar66,auVar68);
            auVar54 = vsubps_avx512vl(auVar55,auVar54);
            auVar60 = vsubps_avx512vl(auVar58,auVar77);
            auVar61 = vsubps_avx512vl(auVar59,auVar78);
            auVar62 = vsubps_avx512vl(auVar54,auVar56);
            auVar63 = vsubps_avx512vl(auVar77,auVar73);
            auVar64 = vsubps_avx512vl(auVar78,auVar74);
            auVar65 = vsubps_avx512vl(auVar56,auVar57);
            auVar66 = vsubps_avx512vl(auVar73,auVar58);
            auVar67 = vsubps_avx512vl(auVar74,auVar59);
            auVar68 = vsubps_avx512vl(auVar57,auVar54);
            auVar55 = vaddps_avx512vl(auVar58,auVar77);
            auVar69 = vaddps_avx512vl(auVar59,auVar78);
            auVar70 = vaddps_avx512vl(auVar54,auVar56);
            auVar71 = vmulps_avx512vl(auVar69,auVar62);
            auVar71 = vfmsub231ps_avx512vl(auVar71,auVar61,auVar70);
            auVar70 = vmulps_avx512vl(auVar70,auVar60);
            auVar72 = vfmsub231ps_avx512vl(auVar70,auVar62,auVar55);
            auVar70._4_4_ = auVar55._4_4_ * auVar61._4_4_;
            auVar70._0_4_ = auVar55._0_4_ * auVar61._0_4_;
            auVar70._8_4_ = auVar55._8_4_ * auVar61._8_4_;
            auVar70._12_4_ = auVar55._12_4_ * auVar61._12_4_;
            auVar70._16_4_ = auVar55._16_4_ * auVar61._16_4_;
            auVar70._20_4_ = auVar55._20_4_ * auVar61._20_4_;
            auVar70._24_4_ = auVar55._24_4_ * auVar61._24_4_;
            auVar70._28_4_ = auVar55._28_4_;
            auVar39 = vfmsub231ps_fma(auVar70,auVar60,auVar69);
            auVar108._0_4_ = auVar39._0_4_ * fVar86;
            auVar108._4_4_ = auVar39._4_4_ * fVar86;
            auVar108._8_4_ = auVar39._8_4_ * fVar86;
            auVar108._12_4_ = auVar39._12_4_ * fVar86;
            auVar108._16_4_ = fVar86 * 0.0;
            auVar108._20_4_ = fVar86 * 0.0;
            auVar108._24_4_ = fVar86 * 0.0;
            auVar108._28_4_ = 0;
            auVar55 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar72);
            auVar70 = vfmadd231ps_avx512vl(auVar55,auVar101,auVar71);
            auVar114._0_4_ = auVar77._0_4_ + auVar73._0_4_;
            auVar114._4_4_ = auVar77._4_4_ + auVar73._4_4_;
            auVar114._8_4_ = auVar77._8_4_ + auVar73._8_4_;
            auVar114._12_4_ = auVar77._12_4_ + auVar73._12_4_;
            auVar114._16_4_ = auVar77._16_4_ + auVar73._16_4_;
            auVar114._20_4_ = auVar77._20_4_ + auVar73._20_4_;
            auVar114._24_4_ = auVar77._24_4_ + auVar73._24_4_;
            auVar114._28_4_ = auVar77._28_4_ + auVar73._28_4_;
            auVar55 = vaddps_avx512vl(auVar78,auVar74);
            auVar69 = vaddps_avx512vl(auVar56,auVar57);
            auVar71 = vmulps_avx512vl(auVar55,auVar65);
            auVar71 = vfmsub231ps_avx512vl(auVar71,auVar64,auVar69);
            auVar69 = vmulps_avx512vl(auVar69,auVar63);
            auVar72 = vfmsub231ps_avx512vl(auVar69,auVar65,auVar114);
            auVar69 = vmulps_avx512vl(auVar114,auVar64);
            auVar55 = vfmsub231ps_avx512vl(auVar69,auVar63,auVar55);
            auVar69._4_4_ = auVar55._4_4_ * fVar86;
            auVar69._0_4_ = auVar55._0_4_ * fVar86;
            auVar69._8_4_ = auVar55._8_4_ * fVar86;
            auVar69._12_4_ = auVar55._12_4_ * fVar86;
            auVar69._16_4_ = auVar55._16_4_ * fVar86;
            auVar69._20_4_ = auVar55._20_4_ * fVar86;
            auVar69._24_4_ = auVar55._24_4_ * fVar86;
            auVar69._28_4_ = auVar55._28_4_;
            auVar55 = vfmadd231ps_avx512vl(auVar69,auVar110,auVar72);
            auVar69 = vfmadd231ps_avx512vl(auVar55,auVar101,auVar71);
            auVar71 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar73 = vaddps_avx512vl(auVar73,auVar58);
            auVar74 = vaddps_avx512vl(auVar74,auVar59);
            auVar54 = vaddps_avx512vl(auVar57,auVar54);
            auVar55 = vmulps_avx512vl(auVar74,auVar68);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar67,auVar54);
            auVar54 = vmulps_avx512vl(auVar54,auVar66);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar68,auVar73);
            auVar57._4_4_ = auVar73._4_4_ * auVar67._4_4_;
            auVar57._0_4_ = auVar73._0_4_ * auVar67._0_4_;
            auVar57._8_4_ = auVar73._8_4_ * auVar67._8_4_;
            auVar57._12_4_ = auVar73._12_4_ * auVar67._12_4_;
            auVar57._16_4_ = auVar73._16_4_ * auVar67._16_4_;
            auVar57._20_4_ = auVar73._20_4_ * auVar67._20_4_;
            auVar57._24_4_ = auVar73._24_4_ * auVar67._24_4_;
            auVar57._28_4_ = auVar73._28_4_;
            auVar39 = vfmsub231ps_fma(auVar57,auVar66,auVar74);
            auVar73 = vmulps_avx512vl(ZEXT1632(auVar39),auVar113);
            auVar73 = vfmadd231ps_avx512vl(auVar73,auVar110,auVar54);
            auVar73 = vfmadd231ps_avx512vl(auVar73,auVar101,auVar55);
            auVar58._0_4_ = auVar70._0_4_ + auVar69._0_4_;
            auVar58._4_4_ = auVar70._4_4_ + auVar69._4_4_;
            auVar58._8_4_ = auVar70._8_4_ + auVar69._8_4_;
            auVar58._12_4_ = auVar70._12_4_ + auVar69._12_4_;
            auVar58._16_4_ = auVar70._16_4_ + auVar69._16_4_;
            auVar58._20_4_ = auVar70._20_4_ + auVar69._20_4_;
            auVar58._24_4_ = auVar70._24_4_ + auVar69._24_4_;
            auVar58._28_4_ = auVar70._28_4_ + auVar69._28_4_;
            local_a20 = vaddps_avx512vl(auVar73,auVar58);
            vandps_avx512vl(local_a20,auVar71);
            auVar54._8_4_ = 0x34000000;
            auVar54._0_8_ = 0x3400000034000000;
            auVar54._12_4_ = 0x34000000;
            auVar54._16_4_ = 0x34000000;
            auVar54._20_4_ = 0x34000000;
            auVar54._24_4_ = 0x34000000;
            auVar54._28_4_ = 0x34000000;
            auVar74 = vmulps_avx512vl(local_a20,auVar54);
            auVar54 = vminps_avx512vl(auVar70,auVar69);
            auVar54 = vminps_avx512vl(auVar54,auVar73);
            auVar55._8_4_ = 0x80000000;
            auVar55._0_8_ = 0x8000000080000000;
            auVar55._12_4_ = 0x80000000;
            auVar55._16_4_ = 0x80000000;
            auVar55._20_4_ = 0x80000000;
            auVar55._24_4_ = 0x80000000;
            auVar55._28_4_ = 0x80000000;
            auVar55 = vxorps_avx512vl(auVar74,auVar55);
            uVar12 = vcmpps_avx512vl(auVar54,auVar55,5);
            auVar54 = vmaxps_avx512vl(auVar70,auVar69);
            auVar73 = vmaxps_avx512vl(auVar54,auVar73);
            uVar13 = vcmpps_avx512vl(auVar73,auVar74,2);
            bVar15 = (byte)uVar12 | (byte)uVar13;
            k = local_cd0;
            ray = local_cc8;
            if (bVar15 != 0) {
              auVar73 = vmulps_avx512vl(auVar64,auVar62);
              auVar74 = vmulps_avx512vl(auVar60,auVar65);
              auVar54 = vmulps_avx512vl(auVar63,auVar61);
              auVar55 = vmulps_avx512vl(auVar67,auVar65);
              auVar57 = vmulps_avx512vl(auVar63,auVar68);
              auVar58 = vmulps_avx512vl(auVar66,auVar64);
              auVar59 = vfmsub213ps_avx512vl(auVar61,auVar65,auVar73);
              auVar61 = vfmsub213ps_avx512vl(auVar62,auVar63,auVar74);
              auVar60 = vfmsub213ps_avx512vl(auVar60,auVar64,auVar54);
              auVar62 = vfmsub213ps_avx512vl(auVar68,auVar64,auVar55);
              auVar64 = vfmsub213ps_avx512vl(auVar66,auVar65,auVar57);
              auVar63 = vfmsub213ps_avx512vl(auVar67,auVar63,auVar58);
              vandps_avx512vl(auVar73,auVar71);
              vandps_avx512vl(auVar55,auVar71);
              uVar32 = vcmpps_avx512vl(auVar63,auVar63,1);
              vandps_avx512vl(auVar74,auVar71);
              vandps_avx512vl(auVar57,auVar71);
              uVar21 = vcmpps_avx512vl(auVar63,auVar63,1);
              vandps_avx512vl(auVar54,auVar71);
              vandps_avx512vl(auVar58,auVar71);
              uVar28 = vcmpps_avx512vl(auVar63,auVar63,1);
              bVar36 = (bool)((byte)uVar32 & 1);
              auVar75._0_4_ = (float)((uint)bVar36 * auVar59._0_4_ | (uint)!bVar36 * auVar62._0_4_);
              bVar36 = (bool)((byte)(uVar32 >> 1) & 1);
              auVar75._4_4_ = (float)((uint)bVar36 * auVar59._4_4_ | (uint)!bVar36 * auVar62._4_4_);
              bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
              auVar75._8_4_ = (float)((uint)bVar36 * auVar59._8_4_ | (uint)!bVar36 * auVar62._8_4_);
              bVar36 = (bool)((byte)(uVar32 >> 3) & 1);
              auVar75._12_4_ =
                   (float)((uint)bVar36 * auVar59._12_4_ | (uint)!bVar36 * auVar62._12_4_);
              bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
              auVar75._16_4_ =
                   (float)((uint)bVar36 * auVar59._16_4_ | (uint)!bVar36 * auVar62._16_4_);
              bVar36 = (bool)((byte)(uVar32 >> 5) & 1);
              auVar75._20_4_ =
                   (float)((uint)bVar36 * auVar59._20_4_ | (uint)!bVar36 * auVar62._20_4_);
              bVar36 = (bool)((byte)(uVar32 >> 6) & 1);
              auVar75._24_4_ =
                   (float)((uint)bVar36 * auVar59._24_4_ | (uint)!bVar36 * auVar62._24_4_);
              bVar36 = SUB81(uVar32 >> 7,0);
              auVar75._28_4_ = (uint)bVar36 * auVar59._28_4_ | (uint)!bVar36 * auVar62._28_4_;
              bVar36 = (bool)((byte)uVar21 & 1);
              auVar76._0_4_ = (float)((uint)bVar36 * auVar61._0_4_ | (uint)!bVar36 * auVar64._0_4_);
              bVar36 = (bool)((byte)(uVar21 >> 1) & 1);
              auVar76._4_4_ = (float)((uint)bVar36 * auVar61._4_4_ | (uint)!bVar36 * auVar64._4_4_);
              bVar36 = (bool)((byte)(uVar21 >> 2) & 1);
              auVar76._8_4_ = (float)((uint)bVar36 * auVar61._8_4_ | (uint)!bVar36 * auVar64._8_4_);
              bVar36 = (bool)((byte)(uVar21 >> 3) & 1);
              auVar76._12_4_ =
                   (float)((uint)bVar36 * auVar61._12_4_ | (uint)!bVar36 * auVar64._12_4_);
              bVar36 = (bool)((byte)(uVar21 >> 4) & 1);
              auVar76._16_4_ =
                   (float)((uint)bVar36 * auVar61._16_4_ | (uint)!bVar36 * auVar64._16_4_);
              bVar36 = (bool)((byte)(uVar21 >> 5) & 1);
              auVar76._20_4_ =
                   (float)((uint)bVar36 * auVar61._20_4_ | (uint)!bVar36 * auVar64._20_4_);
              bVar36 = (bool)((byte)(uVar21 >> 6) & 1);
              auVar76._24_4_ =
                   (float)((uint)bVar36 * auVar61._24_4_ | (uint)!bVar36 * auVar64._24_4_);
              bVar36 = SUB81(uVar21 >> 7,0);
              auVar76._28_4_ = (uint)bVar36 * auVar61._28_4_ | (uint)!bVar36 * auVar64._28_4_;
              bVar36 = (bool)((byte)uVar28 & 1);
              fVar38 = (float)((uint)bVar36 * auVar60._0_4_ | (uint)!bVar36 * auVar63._0_4_);
              bVar36 = (bool)((byte)(uVar28 >> 1) & 1);
              fVar80 = (float)((uint)bVar36 * auVar60._4_4_ | (uint)!bVar36 * auVar63._4_4_);
              bVar36 = (bool)((byte)(uVar28 >> 2) & 1);
              fVar81 = (float)((uint)bVar36 * auVar60._8_4_ | (uint)!bVar36 * auVar63._8_4_);
              bVar36 = (bool)((byte)(uVar28 >> 3) & 1);
              fVar82 = (float)((uint)bVar36 * auVar60._12_4_ | (uint)!bVar36 * auVar63._12_4_);
              bVar36 = (bool)((byte)(uVar28 >> 4) & 1);
              fVar83 = (float)((uint)bVar36 * auVar60._16_4_ | (uint)!bVar36 * auVar63._16_4_);
              bVar36 = (bool)((byte)(uVar28 >> 5) & 1);
              fVar84 = (float)((uint)bVar36 * auVar60._20_4_ | (uint)!bVar36 * auVar63._20_4_);
              bVar36 = (bool)((byte)(uVar28 >> 6) & 1);
              fVar85 = (float)((uint)bVar36 * auVar60._24_4_ | (uint)!bVar36 * auVar63._24_4_);
              bVar36 = SUB81(uVar28 >> 7,0);
              auVar17._4_4_ = fVar86 * fVar80;
              auVar17._0_4_ = fVar86 * fVar38;
              auVar17._8_4_ = fVar86 * fVar81;
              auVar17._12_4_ = fVar86 * fVar82;
              auVar17._16_4_ = fVar86 * fVar83;
              auVar17._20_4_ = fVar86 * fVar84;
              auVar17._24_4_ = fVar86 * fVar85;
              auVar17._28_4_ = fVar86;
              auVar39 = vfmadd213ps_fma(auVar110,auVar76,auVar17);
              auVar39 = vfmadd213ps_fma(auVar101,auVar75,ZEXT1632(auVar39));
              auVar73 = ZEXT1632(CONCAT412(auVar39._12_4_ + auVar39._12_4_,
                                           CONCAT48(auVar39._8_4_ + auVar39._8_4_,
                                                    CONCAT44(auVar39._4_4_ + auVar39._4_4_,
                                                             auVar39._0_4_ + auVar39._0_4_))));
              auVar111._0_4_ = auVar56._0_4_ * fVar38;
              auVar111._4_4_ = auVar56._4_4_ * fVar80;
              auVar111._8_4_ = auVar56._8_4_ * fVar81;
              auVar111._12_4_ = auVar56._12_4_ * fVar82;
              auVar111._16_4_ = auVar56._16_4_ * fVar83;
              auVar111._20_4_ = auVar56._20_4_ * fVar84;
              auVar111._24_4_ = auVar56._24_4_ * fVar85;
              auVar111._28_4_ = 0;
              auVar39 = vfmadd213ps_fma(auVar78,auVar76,auVar111);
              auVar40 = vfmadd213ps_fma(auVar77,auVar75,ZEXT1632(auVar39));
              auVar77 = vrcp14ps_avx512vl(auVar73);
              auVar71._8_4_ = 0x3f800000;
              auVar71._0_8_ = 0x3f8000003f800000;
              auVar71._12_4_ = 0x3f800000;
              auVar71._16_4_ = 0x3f800000;
              auVar71._20_4_ = 0x3f800000;
              auVar71._24_4_ = 0x3f800000;
              auVar71._28_4_ = 0x3f800000;
              auVar78 = vfnmadd213ps_avx512vl(auVar77,auVar73,auVar71);
              auVar39 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
              uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x100);
              local_c40._4_4_ = uVar2;
              local_c40._0_4_ = uVar2;
              local_c40._8_4_ = uVar2;
              local_c40._12_4_ = uVar2;
              local_c40._16_4_ = uVar2;
              local_c40._20_4_ = uVar2;
              local_c40._24_4_ = uVar2;
              local_c40._28_4_ = uVar2;
              auVar119 = ZEXT3264(local_c40);
              local_9a0 = ZEXT1632(CONCAT412(auVar39._12_4_ * (auVar40._12_4_ + auVar40._12_4_),
                                             CONCAT48(auVar39._8_4_ *
                                                      (auVar40._8_4_ + auVar40._8_4_),
                                                      CONCAT44(auVar39._4_4_ *
                                                               (auVar40._4_4_ + auVar40._4_4_),
                                                               auVar39._0_4_ *
                                                               (auVar40._0_4_ + auVar40._0_4_)))));
              uVar12 = vcmpps_avx512vl(local_9a0,local_c40,2);
              uVar2 = *(undefined4 *)(local_cc8 + local_cd0 * 4 + 0x60);
              auVar72._4_4_ = uVar2;
              auVar72._0_4_ = uVar2;
              auVar72._8_4_ = uVar2;
              auVar72._12_4_ = uVar2;
              auVar72._16_4_ = uVar2;
              auVar72._20_4_ = uVar2;
              auVar72._24_4_ = uVar2;
              auVar72._28_4_ = uVar2;
              uVar13 = vcmpps_avx512vl(local_9a0,auVar72,0xd);
              bVar15 = (byte)uVar12 & (byte)uVar13 & bVar15;
              if (bVar15 != 0) {
                local_cd8 = vcmpps_avx512vl(auVar73,_DAT_01faff00,4);
                local_cd8 = bVar15 & local_cd8;
                if ((char)local_cd8 != '\0') {
                  local_a00 = &local_ce9;
                  local_9f8 = (char)local_cd8;
                  auVar77 = vsubps_avx(local_a20,auVar69);
                  local_a60 = vblendps_avx(auVar70,auVar77,0xf0);
                  auVar77 = vsubps_avx(local_a20,auVar70);
                  local_a40 = vblendps_avx(auVar69,auVar77,0xf0);
                  fVar86 = (float)DAT_01fef940;
                  fVar115 = DAT_01fef940._4_4_;
                  local_980._4_4_ = auVar75._4_4_ * fVar115;
                  local_980._0_4_ = auVar75._0_4_ * fVar86;
                  fVar116 = DAT_01fef940._8_4_;
                  local_980._8_4_ = auVar75._8_4_ * fVar116;
                  fVar117 = DAT_01fef940._12_4_;
                  local_980._12_4_ = auVar75._12_4_ * fVar117;
                  fVar118 = DAT_01fef940._16_4_;
                  local_980._16_4_ = auVar75._16_4_ * fVar118;
                  fVar11 = DAT_01fef940._20_4_;
                  local_980._20_4_ = auVar75._20_4_ * fVar11;
                  fVar10 = DAT_01fef940._24_4_;
                  local_980._24_4_ = auVar75._24_4_ * fVar10;
                  local_980._28_4_ = auVar75._28_4_;
                  local_960._4_4_ = auVar76._4_4_ * fVar115;
                  local_960._0_4_ = auVar76._0_4_ * fVar86;
                  local_960._8_4_ = auVar76._8_4_ * fVar116;
                  local_960._12_4_ = auVar76._12_4_ * fVar117;
                  local_960._16_4_ = auVar76._16_4_ * fVar118;
                  local_960._20_4_ = auVar76._20_4_ * fVar11;
                  local_960._24_4_ = auVar76._24_4_ * fVar10;
                  local_960._28_4_ = auVar76._28_4_;
                  local_940._4_4_ = fVar80 * fVar115;
                  local_940._0_4_ = fVar38 * fVar86;
                  local_940._8_4_ = fVar81 * fVar116;
                  local_940._12_4_ = fVar82 * fVar117;
                  local_940._16_4_ = fVar83 * fVar118;
                  local_940._20_4_ = fVar84 * fVar11;
                  local_940._24_4_ = fVar85 * fVar10;
                  local_940._28_4_ = (uint)bVar36 * auVar60._28_4_ | (uint)!bVar36 * auVar63._28_4_;
                  pGVar31 = (local_c68->geometries).items[local_cb8].ptr;
                  if ((pGVar31->mask & *(uint *)(local_cc8 + local_cd0 * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0075fc95:
                      *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                      return bVar37;
                    }
                    auVar77 = vpbroadcastd_avx512vl();
                    auVar77 = vpaddd_avx2(auVar77,_DAT_01fec4a0);
                    auVar78 = vpbroadcastd_avx512vl();
                    auVar78 = vpaddd_avx2(auVar78,_DAT_01fec4c0);
                    auVar93._0_4_ = (float)(int)(*(ushort *)(local_c70 + 8 + local_c78) - 1);
                    auVar93._4_12_ = auVar56._4_12_;
                    auVar20._12_4_ = 0;
                    auVar20._0_12_ = ZEXT812(0);
                    auVar40 = vrcp14ss_avx512f(auVar20 << 0x20,ZEXT416((uint)auVar93._0_4_));
                    auVar39 = vfnmadd213ss_fma(auVar93,auVar40,SUB6416(ZEXT464(0x40000000),0));
                    fVar85 = auVar40._0_4_ * auVar39._0_4_;
                    auVar105._0_4_ = (float)(int)(*(ushort *)(local_c70 + 10 + local_c78) - 1);
                    auVar105._4_12_ = auVar70._4_12_;
                    auVar40 = vrcp14ss_avx512f(auVar20 << 0x20,ZEXT416((uint)auVar105._0_4_));
                    auVar39 = vfnmadd213ss_fma(auVar105,auVar40,SUB6416(ZEXT464(0x40000000),0));
                    fVar115 = auVar40._0_4_ * auVar39._0_4_;
                    auVar77 = vcvtdq2ps_avx(auVar77);
                    auVar78 = vcvtdq2ps_avx(auVar78);
                    auVar16._8_4_ = 0x219392ef;
                    auVar16._0_8_ = 0x219392ef219392ef;
                    auVar16._12_4_ = 0x219392ef;
                    auVar16._16_4_ = 0x219392ef;
                    auVar16._20_4_ = 0x219392ef;
                    auVar16._24_4_ = 0x219392ef;
                    auVar16._28_4_ = 0x219392ef;
                    uVar32 = vcmpps_avx512vl(local_a20,auVar16,5);
                    auVar73 = vrcp14ps_avx512vl(local_a20);
                    auVar94._8_4_ = 0x3f800000;
                    auVar94._0_8_ = 0x3f8000003f800000;
                    auVar94._12_4_ = 0x3f800000;
                    auVar94._16_4_ = 0x3f800000;
                    auVar94._20_4_ = 0x3f800000;
                    auVar94._24_4_ = 0x3f800000;
                    auVar94._28_4_ = 0x3f800000;
                    auVar39 = vfnmadd213ps_fma(local_a20,auVar73,auVar94);
                    auVar74 = vfmadd132ps_avx512vl(ZEXT1632(auVar39),auVar73,auVar73);
                    fVar38 = (float)((uint)((byte)uVar32 & 1) * auVar74._0_4_);
                    fVar80 = (float)((uint)((byte)(uVar32 >> 1) & 1) * auVar74._4_4_);
                    fVar81 = (float)((uint)((byte)(uVar32 >> 2) & 1) * auVar74._8_4_);
                    fVar82 = (float)((uint)((byte)(uVar32 >> 3) & 1) * auVar74._12_4_);
                    fVar86 = (float)((uint)((byte)(uVar32 >> 4) & 1) * auVar74._16_4_);
                    fVar83 = (float)((uint)((byte)(uVar32 >> 5) & 1) * auVar74._20_4_);
                    fVar84 = (float)((uint)((byte)(uVar32 >> 6) & 1) * auVar74._24_4_);
                    auVar18._4_4_ =
                         (local_a20._4_4_ * auVar77._4_4_ + local_a60._4_4_) * fVar85 * fVar80;
                    auVar18._0_4_ =
                         (local_a20._0_4_ * auVar77._0_4_ + local_a60._0_4_) * fVar85 * fVar38;
                    auVar18._8_4_ =
                         (local_a20._8_4_ * auVar77._8_4_ + local_a60._8_4_) * fVar85 * fVar81;
                    auVar18._12_4_ =
                         (local_a20._12_4_ * auVar77._12_4_ + local_a60._12_4_) * fVar85 * fVar82;
                    auVar18._16_4_ =
                         (local_a20._16_4_ * auVar77._16_4_ + local_a60._16_4_) * fVar85 * fVar86;
                    auVar18._20_4_ =
                         (local_a20._20_4_ * auVar77._20_4_ + local_a60._20_4_) * fVar85 * fVar83;
                    auVar18._24_4_ =
                         (local_a20._24_4_ * auVar77._24_4_ + local_a60._24_4_) * fVar85 * fVar84;
                    auVar18._28_4_ = auVar73._28_4_;
                    local_9e0 = vminps_avx(auVar18,auVar94);
                    auVar19._4_4_ =
                         (local_a20._4_4_ * auVar78._4_4_ + local_a40._4_4_) * fVar115 * fVar80;
                    auVar19._0_4_ =
                         (local_a20._0_4_ * auVar78._0_4_ + local_a40._0_4_) * fVar115 * fVar38;
                    auVar19._8_4_ =
                         (local_a20._8_4_ * auVar78._8_4_ + local_a40._8_4_) * fVar115 * fVar81;
                    auVar19._12_4_ =
                         (local_a20._12_4_ * auVar78._12_4_ + local_a40._12_4_) * fVar115 * fVar82;
                    auVar19._16_4_ =
                         (local_a20._16_4_ * auVar78._16_4_ + local_a40._16_4_) * fVar115 * fVar86;
                    auVar19._20_4_ =
                         (local_a20._20_4_ * auVar78._20_4_ + local_a40._20_4_) * fVar115 * fVar83;
                    auVar19._24_4_ =
                         (local_a20._24_4_ * auVar78._24_4_ + local_a40._24_4_) * fVar115 * fVar84;
                    auVar19._28_4_ = (uint)(byte)(uVar32 >> 7) * auVar74._28_4_;
                    local_9c0 = vminps_avx(auVar19,auVar94);
                    local_ce0 = 0;
                    for (uVar32 = local_cd8; (uVar32 & 1) == 0;
                        uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                      local_ce0 = local_ce0 + 1;
                    }
                    local_b60 = vpbroadcastd_avx512vl();
                    local_b80 = vpbroadcastd_avx512vl();
                    local_bc0 = auVar121._0_16_;
                    local_bd0 = auVar122._0_16_;
                    local_be0 = auVar123._0_16_;
                    local_bf0 = auVar124._0_16_;
                    local_c00 = auVar125._0_16_;
                    local_c10 = auVar126._0_16_;
                    local_ce8 = pGVar31;
                    do {
                      uVar2 = *(undefined4 *)(local_9e0 + local_ce0 * 4);
                      local_8c0._4_4_ = uVar2;
                      local_8c0._0_4_ = uVar2;
                      local_8c0._8_4_ = uVar2;
                      local_8c0._12_4_ = uVar2;
                      local_8c0._16_4_ = uVar2;
                      local_8c0._20_4_ = uVar2;
                      local_8c0._24_4_ = uVar2;
                      local_8c0._28_4_ = uVar2;
                      uVar2 = *(undefined4 *)(local_9c0 + local_ce0 * 4);
                      local_8a0._4_4_ = uVar2;
                      local_8a0._0_4_ = uVar2;
                      local_8a0._8_4_ = uVar2;
                      local_8a0._12_4_ = uVar2;
                      local_8a0._16_4_ = uVar2;
                      local_8a0._20_4_ = uVar2;
                      local_8a0._24_4_ = uVar2;
                      local_8a0._28_4_ = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_9a0 + local_ce0 * 4);
                      local_bb0.context = context->user;
                      local_920 = *(undefined4 *)(local_980 + local_ce0 * 4);
                      uVar2 = *(undefined4 *)(local_960 + local_ce0 * 4);
                      local_900._4_4_ = uVar2;
                      local_900._0_4_ = uVar2;
                      local_900._8_4_ = uVar2;
                      local_900._12_4_ = uVar2;
                      local_900._16_4_ = uVar2;
                      local_900._20_4_ = uVar2;
                      local_900._24_4_ = uVar2;
                      local_900._28_4_ = uVar2;
                      uVar2 = *(undefined4 *)(local_940 + local_ce0 * 4);
                      local_8e0._4_4_ = uVar2;
                      local_8e0._0_4_ = uVar2;
                      local_8e0._8_4_ = uVar2;
                      local_8e0._12_4_ = uVar2;
                      local_8e0._16_4_ = uVar2;
                      local_8e0._20_4_ = uVar2;
                      local_8e0._24_4_ = uVar2;
                      local_8e0._28_4_ = uVar2;
                      uStack_91c = local_920;
                      uStack_918 = local_920;
                      uStack_914 = local_920;
                      uStack_910 = local_920;
                      uStack_90c = local_920;
                      uStack_908 = local_920;
                      uStack_904 = local_920;
                      local_880 = local_b80._0_8_;
                      uStack_878 = local_b80._8_8_;
                      uStack_870 = local_b80._16_8_;
                      uStack_868 = local_b80._24_8_;
                      local_860 = local_b60;
                      vpcmpeqd_avx2(local_b60,local_b60);
                      uStack_83c = (local_bb0.context)->instID[0];
                      local_840 = uStack_83c;
                      uStack_838 = uStack_83c;
                      uStack_834 = uStack_83c;
                      uStack_830 = uStack_83c;
                      uStack_82c = uStack_83c;
                      uStack_828 = uStack_83c;
                      uStack_824 = uStack_83c;
                      uStack_81c = (local_bb0.context)->instPrimID[0];
                      local_820 = uStack_81c;
                      uStack_818 = uStack_81c;
                      uStack_814 = uStack_81c;
                      uStack_810 = uStack_81c;
                      uStack_80c = uStack_81c;
                      uStack_808 = uStack_81c;
                      uStack_804 = uStack_81c;
                      local_b40 = local_ac0;
                      local_bb0.valid = (int *)local_b40;
                      local_bb0.geometryUserPtr = pGVar31->userPtr;
                      local_bb0.hit = (RTCHitN *)&local_920;
                      local_bb0.N = 8;
                      local_bb0.ray = (RTCRayN *)ray;
                      if (pGVar31->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar31->occlusionFilterN)(&local_bb0);
                        auVar119 = ZEXT3264(local_c40);
                        auVar126 = ZEXT1664(local_c10);
                        auVar125 = ZEXT1664(local_c00);
                        auVar124 = ZEXT1664(local_bf0);
                        auVar123 = ZEXT1664(local_be0);
                        auVar122 = ZEXT1664(local_bd0);
                        auVar121 = ZEXT1664(local_bc0);
                        k = local_cd0;
                        ray = local_cc8;
                        pGVar31 = local_ce8;
                      }
                      if (local_b40 != (undefined1  [32])0x0) {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar31->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var9)(&local_bb0);
                          auVar119 = ZEXT3264(local_c40);
                          auVar126 = ZEXT1664(local_c10);
                          auVar125 = ZEXT1664(local_c00);
                          auVar124 = ZEXT1664(local_bf0);
                          auVar123 = ZEXT1664(local_be0);
                          auVar122 = ZEXT1664(local_bd0);
                          auVar121 = ZEXT1664(local_bc0);
                          k = local_cd0;
                          ray = local_cc8;
                          pGVar31 = local_ce8;
                        }
                        uVar32 = vptestmd_avx512vl(local_b40,local_b40);
                        auVar77 = *(undefined1 (*) [32])(local_bb0.ray + 0x100);
                        auVar78 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar36 = (bool)((byte)uVar32 & 1);
                        auVar79._0_4_ = (uint)bVar36 * auVar78._0_4_ | (uint)!bVar36 * auVar77._0_4_
                        ;
                        bVar36 = (bool)((byte)(uVar32 >> 1) & 1);
                        auVar79._4_4_ = (uint)bVar36 * auVar78._4_4_ | (uint)!bVar36 * auVar77._4_4_
                        ;
                        bVar36 = (bool)((byte)(uVar32 >> 2) & 1);
                        auVar79._8_4_ = (uint)bVar36 * auVar78._8_4_ | (uint)!bVar36 * auVar77._8_4_
                        ;
                        bVar36 = (bool)((byte)(uVar32 >> 3) & 1);
                        auVar79._12_4_ =
                             (uint)bVar36 * auVar78._12_4_ | (uint)!bVar36 * auVar77._12_4_;
                        bVar36 = (bool)((byte)(uVar32 >> 4) & 1);
                        auVar79._16_4_ =
                             (uint)bVar36 * auVar78._16_4_ | (uint)!bVar36 * auVar77._16_4_;
                        bVar36 = (bool)((byte)(uVar32 >> 5) & 1);
                        auVar79._20_4_ =
                             (uint)bVar36 * auVar78._20_4_ | (uint)!bVar36 * auVar77._20_4_;
                        bVar36 = (bool)((byte)(uVar32 >> 6) & 1);
                        auVar79._24_4_ =
                             (uint)bVar36 * auVar78._24_4_ | (uint)!bVar36 * auVar77._24_4_;
                        bVar36 = SUB81(uVar32 >> 7,0);
                        auVar79._28_4_ =
                             (uint)bVar36 * auVar78._28_4_ | (uint)!bVar36 * auVar77._28_4_;
                        *(undefined1 (*) [32])(local_bb0.ray + 0x100) = auVar79;
                        if (local_b40 != (undefined1  [32])0x0) goto LAB_0075fc95;
                      }
                      *(int *)(ray + k * 4 + 0x100) = auVar119._0_4_;
                      uVar32 = local_ce0 & 0x3f;
                      local_ce0 = 0;
                      local_cd8 = local_cd8 ^ 1L << uVar32;
                      for (uVar32 = local_cd8; (uVar32 & 1) == 0;
                          uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                        local_ce0 = local_ce0 + 1;
                      }
                    } while (local_cd8 != 0);
                  }
                }
              }
            }
            local_c80 = local_c80 - 1 & local_c80;
            auVar119 = ZEXT1664(local_b00);
            auVar120 = ZEXT1664(local_b10);
            uVar32 = local_ca8;
            fVar86 = local_ad0;
            fVar81 = fStack_acc;
            fVar82 = fStack_ac8;
            fVar83 = fStack_ac4;
            fVar38 = local_ae0;
            fVar84 = fStack_adc;
            fVar85 = fStack_ad8;
            fVar115 = fStack_ad4;
            fVar80 = local_af0;
            fVar116 = fStack_aec;
            fVar117 = fStack_ae8;
            fVar118 = fStack_ae4;
          } while (local_c80 != 0);
        }
        local_c98 = local_c98 + 1;
      } while (local_c98 != local_c90);
    }
LAB_0075fc7f:
    bVar37 = local_c88 != &local_800;
    if (!bVar37) {
      return bVar37;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }